

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::connection::cgi_forwarder::write_post(cgi_forwarder *this)

{
  size_type sVar1;
  element_type *this_00;
  reference pvVar2;
  offset_in_cgi_forwarder_to_subr in_RDI;
  vector<char,_std::allocator<char>_> *this_01;
  cgi_forwarder *in_stack_00000030;
  enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder> *in_stack_ffffffffffffff78;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *s;
  undefined1 local_10 [16];
  
  if (*(long *)(in_RDI + 0x58) < 1) {
    std::vector<char,_std::allocator<char>_>::swap
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    read_response(in_stack_00000030);
  }
  else {
    s = *(shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> **)(in_RDI + 0x58);
    sVar1 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x80));
    if ((long)s < (long)sVar1) {
      std::vector<char,_std::allocator<char>_>::resize
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    this_00 = std::
              __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x382634);
    this_01 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0x80);
    pvVar2 = std::vector<char,_std::allocator<char>_>::front
                       ((vector<char,_std::allocator<char>_> *)this_00);
    sVar1 = std::vector<char,_std::allocator<char>_>::size(this_01);
    std::enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder>::shared_from_this
              (in_stack_ffffffffffffff78);
    mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
              (in_RDI,s);
    booster::callback<void(std::error_code_const&,unsigned_long)>::
    callback<booster::callable<void(std::error_code_const&,unsigned_long)>>
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)this_00,
               (intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> *)
               in_stack_ffffffffffffff78);
    (*this_00->_vptr_connection[0x11])(this_00,pvVar2,sVar1,local_10);
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x3826e1);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr((intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                    *)this_00);
    std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)0x3826f5);
  }
  return;
}

Assistant:

void write_post()
		{
			if(content_length_ > 0) {
				if(content_length_ <  (long long)(post_.size())) {
					post_.resize(content_length_);
				}
				conn_->async_read_some(&post_.front(),post_.size(),
					mfunc_to_io_handler(&cgi_forwarder::on_post_data_read,shared_from_this()));
			}
			else {
				response_.swap(post_);
				response_.resize(8192);
				read_response();
			}
		}